

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2EndDocument(void *ctx)

{
  uint uVar1;
  xmlChar *pxVar2;
  xmlParserCtxtPtr ctxt;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (*(long *)((long)ctx + 0x10) != 0)) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x50) != 0))
    {
      uVar1 = xmlValidateDocumentFinal
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10));
      *(uint *)((long)ctx + 0x98) = uVar1 & *(uint *)((long)ctx + 0x98);
    }
    if (((*(long *)((long)ctx + 0x28) != 0) && (*(long *)((long)ctx + 0x10) != 0)) &&
       (*(long *)(*(long *)((long)ctx + 0x10) + 0x70) == 0)) {
      *(undefined8 *)(*(long *)((long)ctx + 0x10) + 0x70) = *(undefined8 *)((long)ctx + 0x28);
      *(undefined8 *)((long)ctx + 0x28) = 0;
    }
    if (((*(long *)((long)ctx + 0x48) != 0) && (0 < *(int *)((long)ctx + 0x40))) &&
       ((**(long **)((long)ctx + 0x48) != 0 &&
        (((*(long *)(**(long **)((long)ctx + 0x48) + 0x50) != 0 &&
          (*(long *)((long)ctx + 0x10) != 0)) &&
         (*(long *)(*(long *)((long)ctx + 0x10) + 0x70) == 0)))))) {
      pxVar2 = xmlStrdup(*(xmlChar **)(**(long **)((long)ctx + 0x48) + 0x50));
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x70) = pxVar2;
    }
    if (((*(int *)((long)ctx + 0x198) != 0) && (*(long *)((long)ctx + 0x10) != 0)) &&
       (*(int *)(*(long *)((long)ctx + 0x10) + 0x90) == 0)) {
      *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x90) = *(undefined4 *)((long)ctx + 0x198);
    }
  }
  return;
}

Assistant:

void
xmlSAX2EndDocument(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2EndDocument()\n");
#endif
    if (ctx == NULL) return;
#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
	ctxt->valid &= xmlValidateDocumentFinal(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Grab the encoding if it was added on-the-fly
     */
    if ((ctxt->encoding != NULL) && (ctxt->myDoc != NULL) &&
	(ctxt->myDoc->encoding == NULL)) {
	ctxt->myDoc->encoding = ctxt->encoding;
	ctxt->encoding = NULL;
    }
    if ((ctxt->inputTab != NULL) &&
        (ctxt->inputNr > 0) && (ctxt->inputTab[0] != NULL) &&
        (ctxt->inputTab[0]->encoding != NULL) && (ctxt->myDoc != NULL) &&
	(ctxt->myDoc->encoding == NULL)) {
	ctxt->myDoc->encoding = xmlStrdup(ctxt->inputTab[0]->encoding);
    }
    if ((ctxt->charset != XML_CHAR_ENCODING_NONE) && (ctxt->myDoc != NULL) &&
	(ctxt->myDoc->charset == XML_CHAR_ENCODING_NONE)) {
	ctxt->myDoc->charset = ctxt->charset;
    }
}